

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O3

Fl_Shared_Image * Fl_Shared_Image::find(char *name,int W,int H)

{
  int *piVar1;
  Fl_Shared_Image *pFVar2;
  Fl_Image *this;
  size_t sVar3;
  _func_int **__dest;
  long *plVar4;
  Fl_Shared_Image *key;
  Fl_Image *local_30;
  
  if (num_images_ != 0) {
    this = (Fl_Image *)operator_new(0x48);
    Fl_Image::Fl_Image(this,0,0,0);
    this->_vptr_Fl_Image = (_func_int **)&PTR__Fl_Shared_Image_00279130;
    this[1]._vptr_Fl_Image = (_func_int **)0x0;
    this[1].w_ = 0;
    this[1].h_ = 1;
    this[1].d_ = 0;
    this[1].ld_ = 0;
    this[1].count_ = 0;
    local_30 = this;
    sVar3 = strlen(name);
    __dest = (_func_int **)operator_new__(sVar3 + 1);
    this[1]._vptr_Fl_Image = __dest;
    strcpy((char *)__dest,name);
    this->w_ = W;
    this->h_ = H;
    plVar4 = (long *)bsearch(&local_30,images_,(long)num_images_,8,compare);
    if (local_30 != (Fl_Image *)0x0) {
      (*local_30->_vptr_Fl_Image[1])();
    }
    if (plVar4 != (long *)0x0) {
      pFVar2 = (Fl_Shared_Image *)*plVar4;
      piVar1 = &pFVar2->refcount_;
      *piVar1 = *piVar1 + 1;
      return pFVar2;
    }
  }
  return (Fl_Shared_Image *)0x0;
}

Assistant:

Fl_Shared_Image* Fl_Shared_Image::find(const char *name, int W, int H) {
  Fl_Shared_Image	*key,		// Image key
			**match;	// Matching image

  if (num_images_) {
    key = new Fl_Shared_Image();
    key->name_ = new char[strlen(name) + 1];
    strcpy((char *)key->name_, name);
    key->w(W);
    key->h(H);

    match = (Fl_Shared_Image **)bsearch(&key, images_, num_images_,
                                        sizeof(Fl_Shared_Image *),
                                        (compare_func_t)compare);

    delete key;

    if (match) {
      (*match)->refcount_ ++;
      return *match;
    }
  }

  return 0;
}